

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsCalibration.cpp
# Opt level: O2

LineParameters
deqp::gls::theilSenLinearRegression
          (vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *dataPoints)

{
  pointer pVVar1;
  pointer pVVar2;
  LineParameters LVar3;
  undefined1 auVar4 [12];
  ulong uVar5;
  int j;
  ulong uVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined8 uVar11;
  undefined1 auVar10 [16];
  vector<float,_std::allocator<float>_> pointwiseOffsets;
  vector<float,_std::allocator<float>_> pairwiseCoefficients;
  float local_9c;
  _Vector_base<float,_std::allocator<float>_> local_98;
  undefined1 local_78 [16];
  _Vector_base<float,_std::allocator<float>_> local_68;
  ulong local_50;
  undefined1 local_48 [16];
  
  uVar5 = (ulong)((long)(dataPoints->
                        super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(dataPoints->
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) >> 3;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = 0;
  local_50 = uVar5 & 0xffffffff;
  if ((int)uVar5 < 1) {
    local_50 = uVar6;
  }
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (; uVar5 = local_50, uVar6 != local_50; uVar6 = uVar6 + 1) {
    pVVar1 = (dataPoints->
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      pVVar2 = (dataPoints->
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      fVar7 = pVVar1[uVar6].m_data[0] - pVVar2[uVar5].m_data[0];
      fVar8 = -fVar7;
      if (-fVar7 <= fVar7) {
        fVar8 = fVar7;
      }
      if (1e-06 < fVar8) {
        local_9c = (pVVar1[uVar6].m_data[1] - pVVar2[uVar5].m_data[1]) / fVar7;
        std::vector<float,_std::allocator<float>_>::emplace_back<float>
                  ((vector<float,_std::allocator<float>_> *)&local_68,&local_9c);
      }
    }
  }
  if (local_68._M_impl.super__Vector_impl_data._M_start ==
      local_68._M_impl.super__Vector_impl_data._M_finish) {
    fVar8 = 0.0;
  }
  else {
    fVar8 = destructiveMedian<float>((vector<float,_std::allocator<float>_> *)&local_68);
  }
  local_78 = ZEXT416((uint)fVar8) << 0x20;
  auVar9._0_8_ = CONCAT44(fVar8,fVar8) ^ 0x8000000080000000;
  auVar9._8_4_ = -fVar8;
  auVar9._12_4_ = -fVar8;
  local_48 = auVar9;
  for (uVar6 = 0; uVar11 = auVar9._8_8_, uVar5 != uVar6; uVar6 = uVar6 + 1) {
    pVVar1 = (dataPoints->
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    local_9c = pVVar1[uVar6].m_data[0] * (float)local_48._0_4_ + pVVar1[uVar6].m_data[1];
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              ((vector<float,_std::allocator<float>_> *)&local_98,&local_9c);
  }
  if (local_98._M_impl.super__Vector_impl_data._M_start !=
      local_98._M_impl.super__Vector_impl_data._M_finish) {
    fVar8 = destructiveMedian<float>((vector<float,_std::allocator<float>_> *)&local_98);
    auVar4._4_8_ = uVar11;
    auVar4._0_4_ = local_78._4_4_;
    auVar10._0_8_ = auVar4._0_8_ << 0x20;
    auVar10._8_4_ = local_78._8_4_;
    auVar10._12_4_ = local_78._12_4_;
    local_78._4_12_ = auVar10._4_12_;
    local_78._0_4_ = fVar8;
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_98);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_68);
  LVar3.offset = (float)local_78._0_4_;
  LVar3.coefficient = (float)local_78._4_4_;
  return LVar3;
}

Assistant:

LineParameters theilSenLinearRegression (const std::vector<tcu::Vec2>& dataPoints)
{
	const float		epsilon					= 1e-6f;

	const int		numDataPoints			= (int)dataPoints.size();
	vector<float>	pairwiseCoefficients;
	vector<float>	pointwiseOffsets;
	LineParameters	result					(0.0f, 0.0f);

	// Compute the pairwise coefficients.
	for (int i = 0; i < numDataPoints; i++)
	{
		const Vec2& ptA = dataPoints[i];

		for (int j = 0; j < i; j++)
		{
			const Vec2& ptB = dataPoints[j];

			if (de::abs(ptA.x() - ptB.x()) > epsilon)
				pairwiseCoefficients.push_back((ptA.y() - ptB.y()) / (ptA.x() - ptB.x()));
		}
	}

	// Find the median of the pairwise coefficients.
	// \note If there are no data point pairs with differing x values, the coefficient variable will stay zero as initialized.
	if (!pairwiseCoefficients.empty())
		result.coefficient = destructiveMedian(pairwiseCoefficients);

	// Compute the offsets corresponding to the median coefficient, for all data points.
	for (int i = 0; i < numDataPoints; i++)
		pointwiseOffsets.push_back(dataPoints[i].y() - result.coefficient*dataPoints[i].x());

	// Find the median of the offsets.
	// \note If there are no data points, the offset variable will stay zero as initialized.
	if (!pointwiseOffsets.empty())
		result.offset = destructiveMedian(pointwiseOffsets);

	return result;
}